

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O1

size_t vbmi2_despace(char *bytes,size_t howmany)

{
  undefined8 uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  
  if (howmany < 0x40) {
    uVar3 = 0;
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    auVar6 = vpbroadcastb_avx512bw(ZEXT116(0x20));
    uVar4 = 0;
    do {
      auVar7 = vmovdqu64_avx512f(*(undefined1 (*) [64])(bytes + uVar4));
      uVar1 = vpcmpgtb_avx512bw(auVar7,auVar6);
      auVar7 = vpcompressb_avx512_vbmi2(auVar7,uVar1);
      *(undefined1 (*) [64])(bytes + sVar2) = auVar7;
      sVar2 = POPCOUNT(uVar1) + sVar2;
      uVar3 = uVar4 + 0x40;
      uVar5 = uVar4 + 0x7f;
      uVar4 = uVar3;
    } while (uVar5 < howmany);
  }
  if (uVar3 < howmany) {
    do {
      if (' ' < bytes[uVar3]) {
        bytes[sVar2] = bytes[uVar3];
        sVar2 = sVar2 + 1;
      }
      uVar3 = uVar3 + 1;
    } while (howmany != uVar3);
  }
  return sVar2;
}

Assistant:

size_t vbmi2_despace(char *bytes, size_t howmany) {
  size_t pos = 0;
  __m512i spaces = _mm512_set1_epi8(' ');
  size_t i = 0;
  for (; i + 63 < howmany; i += 64) {
    __m512i x = _mm512_loadu_si512((const __m512i *)(bytes + i));
    __mmask64  notwhite = _mm512_cmpgt_epi8_mask  (x, spaces);
    _mm512_mask_compressstoreu_epi8  (bytes + pos, notwhite, x);
    pos += _popcnt64(notwhite);
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c <= ' ') {
      continue;
    }
    bytes[pos++] = c;
  }
  return pos;
}